

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise.h
# Opt level: O2

void gimage::addScaledNoise<float>(Image<float,_gimage::PixelTraits<float>_> *image,float stddev)

{
  float *pfVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long k;
  long lVar5;
  double dVar6;
  double r2;
  double r1;
  double local_40;
  double local_38;
  
  for (lVar3 = 0; lVar3 < image->depth; lVar3 = lVar3 + 1) {
    for (lVar5 = 0; lVar5 < image->height; lVar5 = lVar5 + 1) {
      lVar2 = image->width;
      for (lVar4 = 0; lVar4 < lVar2; lVar4 = lVar4 + 2) {
        getBoxMuller(&local_38,&local_40,(double)stddev);
        pfVar1 = image->img[(int)lVar3][lVar5];
        dVar6 = (local_38 * (double)pfVar1[lVar4]) / 3.4028234663852886e+38 + (double)pfVar1[lVar4];
        if (3.4028234663852886e+38 <= dVar6) {
          dVar6 = 3.4028234663852886e+38;
        }
        if (dVar6 <= -3.4028234663852886e+38) {
          dVar6 = -3.4028234663852886e+38;
        }
        pfVar1[lVar4] = (float)dVar6;
        lVar2 = image->width;
        if (lVar4 + 1 < lVar2) {
          dVar6 = (local_40 * (double)pfVar1[lVar4 + 1]) / 3.4028234663852886e+38 +
                  (double)pfVar1[lVar4 + 1];
          if (3.4028234663852886e+38 <= dVar6) {
            dVar6 = 3.4028234663852886e+38;
          }
          if (dVar6 <= -3.4028234663852886e+38) {
            dVar6 = -3.4028234663852886e+38;
          }
          pfVar1[lVar4 + 1] = (float)dVar6;
        }
      }
    }
  }
  return;
}

Assistant:

void addScaledNoise(Image<T> &image, float stddev)
{
  double vmin=image.absMinValue();
  double vmax=image.absMaxValue();

  for (long d=0; d<image.getDepth(); d++)
  {
    for (long k=0; k<image.getHeight(); k++)
    {
      for (long i=0; i<image.getWidth(); i+=2)
      {
        double r1, r2;
        getBoxMuller(r1, r2, stddev);

        double v=image.get(i, k, d);
        v=std::max(vmin, std::min(vmax, v+r1*v/vmax));
        image.set(i, k, d, static_cast<typename Image<T>::store_t>(v));

        if (i+1 < image.getWidth())
        {
          v=image.get(i+1, k, d);
          v=std::max(vmin, std::min(vmax, v+r2*v/vmax));
          image.set(i+1, k, d, static_cast<typename Image<T>::store_t>(v));
        }
      }
    }
  }
}